

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[24],wabt::(anonymous_namespace)::StackVar,char_const(&)[7],wabt::(anonymous_namespace)::StackVar,char_const(&)[8],wabt::(anonymous_namespace)::StackVar,char_const(&)[8],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [24],StackVar *u,char (*args) [7],StackVar *args_1,
          char (*args_2) [8],StackVar *args_3,char (*args_4) [8],Newline *args_5)

{
  string_view local_48;
  char (*local_38) [8];
  char (*args_local_2) [8];
  StackVar *args_local_1;
  char (*args_local) [7];
  StackVar *u_local;
  char (*t_local) [24];
  CWriter *this_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [8])args_1;
  args_local_1 = (StackVar *)args;
  args_local = (char (*) [7])u;
  u_local = (StackVar *)t;
  t_local = (char (*) [24])this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,*t);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_48);
  anon_unknown_0::CWriter::Write((CWriter *)this,(StackVar *)args_local);
  Write<char_const(&)[7],wabt::(anonymous_namespace)::StackVar,char_const(&)[8],wabt::(anonymous_namespace)::StackVar,char_const(&)[8],wabt::(anonymous_namespace)::Newline>
            (this,(char (*) [7])args_local_1,(StackVar *)args_local_2,local_38,args_3,args_4,args_5)
  ;
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }